

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bgpsec.c
# Opt level: O0

rtr_secure_path_seg * rtr_bgpsec_pop_secure_path_seg(rtr_bgpsec *bgpsec)

{
  long lVar1;
  long in_FS_OFFSET;
  rtr_secure_path_seg *tmp;
  rtr_bgpsec *bgpsec_local;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (bgpsec->path == (rtr_secure_path_seg *)0x0) {
    bgpsec_local = (rtr_bgpsec *)0x0;
  }
  else {
    bgpsec_local = (rtr_bgpsec *)bgpsec->path;
    bgpsec->path = bgpsec->path->next;
    bgpsec->path_len = bgpsec->path_len + 0xff;
    bgpsec_local->alg = '\0';
    bgpsec_local->safi = '\0';
    bgpsec_local->afi = 0;
    bgpsec_local->my_as = 0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (rtr_secure_path_seg *)bgpsec_local;
  }
  __stack_chk_fail();
}

Assistant:

struct rtr_secure_path_seg *rtr_bgpsec_pop_secure_path_seg(struct rtr_bgpsec *bgpsec)
{
	struct rtr_secure_path_seg *tmp = NULL;

	if (!bgpsec->path)
		return NULL;

	tmp = bgpsec->path;
	bgpsec->path = bgpsec->path->next;
	bgpsec->path_len--;
	tmp->next = NULL;
	return tmp;
}